

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_id_t * ztast_id(ztast_t *ast,char *name)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  ztast_id_t *id;
  size_t namelen;
  undefined8 local_8;
  
  sVar1 = strlen(in_RSI);
  local_8 = (ztast_id_t *)(**(code **)(in_RDI + 8))(sVar1 + 1,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_id_t *)0x0) {
    local_8 = (ztast_id_t *)0x0;
  }
  else {
    memcpy(local_8,in_RSI,sVar1 + 1);
  }
  return local_8;
}

Assistant:

ztast_id_t *ztast_id(ztast_t *ast, const char *name)
{
  size_t      namelen;
  ztast_id_t *id;

  assert(ast);
  assert(name);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_id\n");
#endif

  namelen = strlen(name);
  id = ZTAST_MALLOC(offsetof(ztast_id_t, name) + namelen + 1);
  if (id == NULL)
    return NULL;

  memcpy(id->name, name, namelen + 1);

  return id;
}